

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

Parent * __thiscall
kj::_::BTreeImpl::insertHelper<kj::_::BTreeImpl::Parent>
          (BTreeImpl *this,SearchKey *searchKey,Parent *node,Parent *parent,uint indexInParent,
          uint pos)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  AllocResult<kj::_::BTreeImpl::Parent> AVar4;
  AllocResult<kj::_::BTreeImpl::Parent> AVar5;
  uint pivot_1;
  AllocResult<kj::_::BTreeImpl::Parent> n;
  uint pivot;
  AllocResult<kj::_::BTreeImpl::Parent> n2;
  AllocResult<kj::_::BTreeImpl::Parent> n1;
  uint pos_local;
  uint indexInParent_local;
  Parent *parent_local;
  Parent *node_local;
  SearchKey *searchKey_local;
  BTreeImpl *this_local;
  
  bVar1 = Parent::isFull(node);
  this_local = (BTreeImpl *)node;
  if (bVar1) {
    if (parent == (Parent *)0x0) {
      AVar4 = alloc<kj::_::BTreeImpl::Parent>(this);
      AVar5 = alloc<kj::_::BTreeImpl::Parent>(this);
      this_local = (BTreeImpl *)AVar5.node;
      uVar2 = split(this,(Parent *)this_local,AVar5.index,node,pos);
      move(this,AVar4.node,AVar4.index,node);
      Parent::initRoot((Parent *)this->tree,uVar2,AVar4.index,AVar5.index);
      this->height = this->height + 1;
      uVar3 = (*searchKey->_vptr_SearchKey[2])(searchKey,(ulong)uVar2);
      if ((uVar3 & 1) == 0) {
        this_local = (BTreeImpl *)AVar4.node;
      }
    }
    else {
      AVar4 = alloc<kj::_::BTreeImpl::Parent>(this);
      this_local = (BTreeImpl *)AVar4.node;
      uVar2 = split(this,(Parent *)this_local,AVar4.index,node,pos);
      Parent::insertAfter(parent,indexInParent,uVar2,AVar4.index);
      uVar3 = (*searchKey->_vptr_SearchKey[2])(searchKey,(ulong)uVar2);
      if ((uVar3 & 1) == 0) {
        this_local = (BTreeImpl *)node;
      }
    }
  }
  return (Parent *)this_local;
}

Assistant:

Node& BTreeImpl::insertHelper(const SearchKey& searchKey,
    Node& node, Parent* parent, uint indexInParent, uint pos) {
  if (node.isFull()) {
    // This node is full. Need to split.
    if (parent == nullptr) {
      // This is the root node. We need to split into two nodes and create a new root.
      auto n1 = alloc<Node>();
      auto n2 = alloc<Node>();

      uint pivot = split(n2.node, n2.index, node, pos);
      move(n1.node, n1.index, node);

      // Rewrite root to have the two children.
      tree[0].parent.initRoot(pivot, n1.index, n2.index);

      // Increased height.
      ++height;

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the right one
        return n2.node;
      } else {
        // the left one
        return n1.node;
      }
    } else {
      // This is a non-root parent node. We need to split it into two and insert the new node
      // into the grandparent.
      auto n = alloc<Node>();
      uint pivot = split(n.node, n.index, node, pos);

      // Insert new child into grandparent.
      parent->insertAfter(indexInParent, pivot, n.index);

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the new one, which is right of the original
        return n.node;
      } else {
        // the original one, which is left of the new one
        return node;
      }
    }
  } else {
    // No split needed.
    return node;
  }
}